

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapePrism>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  TPZManVector<int,_27> scalarOrders;
  int aiStack_158 [2];
  TPZManVector<int,_20> local_150;
  TPZManVector<int,_27> local_c0;
  long lVar10;
  
  piVar3 = local_150.fExtAlloc;
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
  uVar8 = ids->fNElements;
  if ((long)uVar8 < 9) {
    local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
    if (0 < (long)uVar8) goto LAB_0100a444;
  }
  else {
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
    local_150.super_TPZVec<int>.fNAlloc = uVar8;
LAB_0100a444:
    plVar1 = ids->fStore;
    uVar6 = 0;
    do {
      *(long *)(local_150.super_TPZVec<int>.fStore + uVar6 * 2) = plVar1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  local_150.super_TPZVec<int>.fNElements = uVar8;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_150);
  if (local_150.super_TPZVec<int>.fStore != piVar3) {
    local_150.super_TPZVec<int>.fNAlloc = 0;
    local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_150.super_TPZVec<int>.fStore);
    }
  }
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018237a0;
  uVar8 = sideorient->fNElements;
  if ((long)uVar8 < 0x15) {
    local_150.super_TPZVec<int>.fStore = piVar3;
    if ((long)uVar8 < 1) goto LAB_0100a51d;
  }
  else {
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
    local_150.super_TPZVec<int>.fNAlloc = uVar8;
  }
  piVar2 = sideorient->fStore;
  uVar6 = 0;
  do {
    local_150.super_TPZVec<int>.fStore[uVar6] = piVar2[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar8 != uVar6);
LAB_0100a51d:
  local_150.super_TPZVec<int>.fNElements = uVar8;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_150);
  if (local_150.super_TPZVec<int>.fStore != piVar3) {
    local_150.super_TPZVec<int>.fNAlloc = 0;
    local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_150.super_TPZVec<int>.fStore);
    }
  }
  iVar7 = connectorders->fStore[5] + 1;
  TPZVec<int>::TPZVec(&local_150.super_TPZVec<int>,0);
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
  local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
  local_150.super_TPZVec<int>.fNElements = 0xf;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  lVar5 = 0xb;
  auVar9 = _DAT_014d2b10;
  auVar11 = _DAT_014d28b0;
  do {
    if (SUB164(auVar11 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar11 ^ _DAT_014d28c0,0) < -0x7ffffff1) {
      aiStack_158[lVar5 + -1] = iVar7;
      aiStack_158[lVar5] = iVar7;
    }
    if (SUB164(auVar9 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar9 ^ _DAT_014d28c0,0) < -0x7ffffff1) {
      aiStack_158[lVar5 + 1] = iVar7;
      local_150.fExtAlloc[lVar5 + -8] = iVar7;
    }
    lVar10 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 4;
    auVar11._8_8_ = lVar10 + 4;
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 4;
    auVar9._8_8_ = lVar10 + 4;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x1b);
  TPZShapeH1<pzshape::TPZShapePrism>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&local_150.super_TPZVec<int>,data);
  if (connectorders->fNElements == 6) {
    local_c0.super_TPZVec<int>.fStore = local_c0.fExtAlloc;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
    local_c0.super_TPZVec<int>.fNElements = 6;
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    piVar3 = connectorders->fStore;
    lVar5 = 0;
    do {
      local_c0.super_TPZVec<int>.fStore[lVar5] = piVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_c0);
    if (local_c0.super_TPZVec<int>.fStore == local_c0.fExtAlloc) {
      local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    else {
      local_c0.super_TPZVec<int>.fNAlloc = 0;
      local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_c0.super_TPZVec<int>.fStore);
      }
    }
    TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,6);
    lVar5 = 0;
    iVar7 = 0;
    do {
      iVar4 = ComputeNConnectShapeF
                        ((int)lVar5,(data->fHDivConnectOrders).super_TPZVec<int>.fStore[lVar5]);
      (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar5] = iVar4;
      iVar7 = iVar7 + iVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar7);
    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    iVar7 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
    if (1 < (long)iVar7) {
      uVar8 = 0;
      do {
        if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar7 + -1] <
            (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar8]) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                     ,0x3e);
        }
        uVar8 = uVar8 + 1;
      } while (iVar7 - 1 != uVar8);
    }
    if (local_150.super_TPZVec<int>.fStore != local_150.fExtAlloc) {
      local_150.super_TPZVec<int>.fNAlloc = 0;
      local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_150.super_TPZVec<int>.fStore);
      }
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x26);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}